

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetJacTimesB(void *cvode_mem,int which,CVLsJacTimesSetupFnB jtsetupB,
                     CVLsJacTimesVecFnB jtimesB)

{
  int iVar1;
  code *jtimes;
  code *jtsetup;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVLsMemB local_30;
  CVodeBMem local_28;
  CVadjMem local_20;
  CVodeMem local_18;
  
  iVar1 = cvLs_AccessLMemB(cvode_mem,which,"CVodeSetJacTimesB",&local_18,&local_20,&local_28,
                           &local_30);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_30->jtsetupB = jtsetupB;
  local_30->jtimesB = jtimesB;
  jtsetup = cvLsJacTimesSetupBWrapper;
  if (jtsetupB == (CVLsJacTimesSetupFnB)0x0) {
    jtsetup = (CVLsJacTimesSetupFn)0x0;
  }
  jtimes = cvLsJacTimesVecBWrapper;
  if (jtimesB == (CVLsJacTimesVecFnB)0x0) {
    jtimes = (CVLsJacTimesVecFn)0x0;
  }
  iVar1 = CVodeSetJacTimes(local_28->cv_mem,jtsetup,jtimes);
  return iVar1;
}

Assistant:

int CVodeSetJacTimesB(void* cvode_mem, int which, CVLsJacTimesSetupFnB jtsetupB,
                      CVLsJacTimesVecFnB jtimesB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVLsJacTimesSetupFn cvls_jtsetup;
  CVLsJacTimesVecFn cvls_jtimes;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set jacobian routines for the backward problem. */
  cvlsB_mem->jtsetupB = jtsetupB;
  cvlsB_mem->jtimesB  = jtimesB;

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem   = (void*)(cvB_mem->cv_mem);
  cvls_jtsetup = (jtsetupB == NULL) ? NULL : cvLsJacTimesSetupBWrapper;
  cvls_jtimes  = (jtimesB == NULL) ? NULL : cvLsJacTimesVecBWrapper;
  return (CVodeSetJacTimes(cvodeB_mem, cvls_jtsetup, cvls_jtimes));
}